

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall kj::InputStream::read(InputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  void *__buf_00;
  
  iVar1 = (*this->_vptr_InputStream[2])();
  __buf_00 = (void *)CONCAT44(extraout_var,iVar1);
  if (__buf_00 < __buf) {
    read(__fd,__buf_00,(size_t)__buf);
    __buf_00 = __buf;
  }
  return (ssize_t)__buf_00;
}

Assistant:

size_t InputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  size_t n = tryRead(buffer, minBytes, maxBytes);
  KJ_REQUIRE(n >= minBytes, "Premature EOF") {
    // Pretend we read zeros from the input.
    memset(reinterpret_cast<byte*>(buffer) + n, 0, minBytes - n);
    return minBytes;
  }
  return n;
}